

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O0

UINT32 __thiscall VGMPlayer::Render(VGMPlayer *this,UINT32 smplCnt,WAVE_32BS *data)

{
  bool bVar1;
  int iVar2;
  CHIP_DEVICE *pCVar3;
  reference pvVar4;
  DEV_INFO *dacDInf;
  VGM_BASEDEV *clDev;
  UINT8 disable;
  CHIP_DEVICE *cDev;
  size_t curDev;
  INT32 smplStep;
  UINT32 maxSmpl;
  UINT32 smplFileTick;
  UINT32 curSmpl;
  WAVE_32BS *data_local;
  UINT32 smplCnt_local;
  VGMPlayer *this_local;
  
  maxSmpl = 0;
  while( true ) {
    iVar2 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x16])(this,(ulong)this->_playSmpl);
    ParseFile(this,iVar2 - this->_playTick);
    iVar2 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x15])(this,(ulong)this->_fileTick);
    curDev._0_4_ = iVar2 - this->_playSmpl;
    if (((int)(UINT32)curDev < 1) ||
       (bVar1 = std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::empty
                          (&this->_dacStreams), !bVar1)) {
      curDev._0_4_ = 1;
    }
    if (smplCnt - maxSmpl < (UINT32)curDev) {
      curDev._0_4_ = smplCnt - maxSmpl;
    }
    for (cDev = (CHIP_DEVICE *)0x0;
        pCVar3 = (CHIP_DEVICE *)
                 std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::size
                           (&this->_devices), cDev < pCVar3;
        cDev = (CHIP_DEVICE *)((long)&(cDev->base).defInf.dataPtr + 1)) {
      dacDInf = (DEV_INFO *)
                std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::
                operator[](&this->_devices,(size_type)cDev);
      if (((reference)dacDInf)->optID == 0xffffffffffffffff) {
        clDev._7_1_ = 0;
      }
      else {
        clDev._7_1_ = this->_devOpts[((reference)dacDInf)->optID].muteOpts.disable;
      }
      for (; dacDInf != (DEV_INFO *)0x0; dacDInf = *(DEV_INFO **)&dacDInf[3].sampleRate) {
        if ((dacDInf->dataPtr != (DEV_DATA *)0x0) && ((clDev._7_1_ & 1) == 0)) {
          Resmpl_Execute((RESMPL_STATE *)(dacDInf + 1),(UINT32)curDev,data + maxSmpl);
        }
        clDev._7_1_ = (byte)((int)(uint)clDev._7_1_ >> 1);
      }
    }
    for (cDev = (CHIP_DEVICE *)0x0;
        pCVar3 = (CHIP_DEVICE *)
                 std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::size
                           (&this->_dacStreams), cDev < pCVar3;
        cDev = (CHIP_DEVICE *)((long)&(cDev->base).defInf.dataPtr + 1)) {
      pvVar4 = std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::
               operator[](&this->_dacStreams,(size_type)cDev);
      (*((pvVar4->defInf).devDef)->Update)((pvVar4->defInf).dataPtr,(UINT32)curDev,(DEV_SMPL **)0x0)
      ;
    }
    maxSmpl = (UINT32)curDev + maxSmpl;
    this->_playSmpl = (UINT32)curDev + this->_playSmpl;
    if ((this->_psTrigger & 2) != 0) break;
    if (smplCnt <= maxSmpl) {
      return maxSmpl;
    }
  }
  this->_psTrigger = this->_psTrigger & 0xfd;
  return maxSmpl;
}

Assistant:

UINT32 VGMPlayer::Render(UINT32 smplCnt, WAVE_32BS* data)
{
	UINT32 curSmpl;
	UINT32 smplFileTick;
	UINT32 maxSmpl;
	INT32 smplStep;	// might be negative due to rounding errors in Tick2Sample
	size_t curDev;
	
	// Note: use do {} while(), so that "smplCnt == 0" can be used to process until reaching the next sample.
	curSmpl = 0;
	do
	{
		smplFileTick = Sample2Tick(_playSmpl);
		ParseFile(smplFileTick - _playTick);
		
		// render as many samples at once as possible (for better performance)
		maxSmpl = Tick2Sample(_fileTick);
		smplStep = maxSmpl - _playSmpl;
		// When DAC streams are active, limit step size to 1, so that DAC streams and sound chip emulation are in sync.
		if (smplStep < 1 || ! _dacStreams.empty())
			smplStep = 1;	// must render at least 1 sample in order to advance
		if ((UINT32)smplStep > smplCnt - curSmpl)
			smplStep = smplCnt - curSmpl;
		
		for (curDev = 0; curDev < _devices.size(); curDev ++)
		{
			CHIP_DEVICE* cDev = &_devices[curDev];
			UINT8 disable = (cDev->optID != (size_t)-1) ? _devOpts[cDev->optID].muteOpts.disable : 0x00;
			VGM_BASEDEV* clDev;
			
			for (clDev = &cDev->base; clDev != NULL; clDev = clDev->linkDev, disable >>= 1)
			{
				if (clDev->defInf.dataPtr != NULL && ! (disable & 0x01))
					Resmpl_Execute(&clDev->resmpl, smplStep, &data[curSmpl]);
			}
		}
		for (curDev = 0; curDev < _dacStreams.size(); curDev ++)
		{
			DEV_INFO* dacDInf = &_dacStreams[curDev].defInf;
			dacDInf->devDef->Update(dacDInf->dataPtr, smplStep, NULL);
		}
		
		curSmpl += smplStep;
		_playSmpl += smplStep;
		if (_psTrigger & PLAYSTATE_END)
		{
			_psTrigger &= ~PLAYSTATE_END;
			break;
		}
	} while(curSmpl < smplCnt);
	
	return curSmpl;
}